

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseSafe(Parser *this)

{
  int iVar1;
  Token *pTVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var6;
  Lexer *this_00;
  Parser *in_RSI;
  Lexer *lexer;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Position pos;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_60;
  Position local_58;
  Position local_40;
  
  pTVar2 = in_RSI->lexer->currentToken;
  local_58.line = (pTVar2->pos).line;
  local_58.startIndex = (pTVar2->pos).startIndex;
  local_58.endIndex = (pTVar2->pos).endIndex;
  sanityExpect(in_RSI,TOK_KW_SAFE);
  parseExpression((Parser *)&local_60,(Precedence)in_RSI);
  if ((Lexer *)local_60._M_head_impl != (Lexer *)0x0) {
    Position::operator+(&local_40,&local_58,&(local_60._M_head_impl)->pos);
    _Var6._M_head_impl = local_60._M_head_impl;
    local_58.endIndex = local_40.endIndex;
    local_58.line = local_40.line;
    local_58.startIndex = CONCAT44(local_40.startIndex._4_4_,(_Rb_tree_color)local_40.startIndex);
    iVar1 = *(int *)&(((string *)&(local_60._M_head_impl)->type)->_M_dataplus)._M_p;
    if (iVar1 - 0x15U < 3) {
      lexer = in_RSI->lexer;
      this_00 = (Lexer *)operator_new(0x40);
LAB_0010daa0:
      SafeExpr::SafeExpr((SafeExpr *)this_00,lexer,&local_58,
                         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_60
                        );
      local_40.line = 0;
      this->lexer = this_00;
      std::unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)&local_40
                );
      goto LAB_0010dbad;
    }
    if (iVar1 == 0x12) {
      if ((local_60._M_head_impl)->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_00128998) {
LAB_0010dbcc:
        __cxa_bad_cast();
      }
      if (*(short *)&local_60._M_head_impl[1].parent == 0x2f) {
        lexer = in_RSI->lexer;
        this_00 = (Lexer *)operator_new(0x40);
        goto LAB_0010daa0;
      }
    }
    else if (iVar1 == 0x13) {
      if ((local_60._M_head_impl)->_vptr_Expr != (_func_int **)&PTR__UnOpExpr_001289c0)
      goto LAB_0010dbcc;
      if (*(short *)(((_Alloc_hider *)&local_60._M_head_impl[1]._vptr_Expr)->_M_p + 0x10) == 0x2f) {
        lexer = in_RSI->lexer;
        this_00 = (Lexer *)operator_new(0x40);
        goto LAB_0010daa0;
      }
    }
    else {
      local_40.line = (size_t)operator_new(0x38);
      sVar4 = ((_Var6._M_head_impl)->pos).line;
      sVar5 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&((_Var6._M_head_impl)->pos).startIndex)->_M_allocated_capacity;
      sVar3 = ((_Var6._M_head_impl)->pos).endIndex;
      ((Error<pfederc::SyntaxErrorCode> *)local_40.line)->logLevel = LVL_ERROR;
      ((Error<pfederc::SyntaxErrorCode> *)local_40.line)->err = STX_ERR_EXPECTED_CONSTRUCTION;
      (((Error<pfederc::SyntaxErrorCode> *)local_40.line)->pos).line = sVar4;
      (((Error<pfederc::SyntaxErrorCode> *)local_40.line)->pos).startIndex = sVar5;
      (((Error<pfederc::SyntaxErrorCode> *)local_40.line)->pos).endIndex = sVar3;
      (((Error<pfederc::SyntaxErrorCode> *)local_40.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((Error<pfederc::SyntaxErrorCode> *)local_40.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((Error<pfederc::SyntaxErrorCode> *)local_40.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generateError((Parser *)&stack0xffffffffffffffd8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffd8);
      if ((Error<pfederc::SyntaxErrorCode> *)local_40.line != (Error<pfederc::SyntaxErrorCode> *)0x0
         ) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_40,
                   (Error<pfederc::SyntaxErrorCode> *)local_40.line);
      }
    }
  }
  this->lexer = (Lexer *)0x0;
LAB_0010dbad:
  if ((Lexer *)local_60._M_head_impl != (Lexer *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Expr[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSafe() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_SAFE);

  std::unique_ptr<Expr> expr(parseExpression());

  if (!expr)
    return nullptr;

  pos = pos + expr->getPosition();

  switch (expr->getType()) {
	case ExprType::EXPR_ARRLIT:
  case ExprType::EXPR_ARRCPY:
  case ExprType::EXPR_ARREMPTY:
    return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
	case ExprType::EXPR_UNOP:
    if (dynamic_cast<const UnOpExpr&>(*expr).getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN)
      return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
    break;
	case ExprType::EXPR_BIOP:
    if (dynamic_cast<const BiOpExpr&>(*expr).getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN)
      return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
    break;
  default:
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CONSTRUCTION,
      expr->getPosition()));
    return nullptr;
  }

  return nullptr;
}